

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.h
# Opt level: O0

bool Memory::HeapBlockList::
     Contains<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
               (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *block,
               SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *list,
               SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *tail)

{
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *local_30;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *heapBlock;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *tail_local;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *list_local;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *block_local;
  
  local_30 = list;
  while( true ) {
    if (local_30 == tail) {
      return false;
    }
    if (local_30 == block) break;
    local_30 = SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::GetNextBlock(local_30);
  }
  return true;
}

Assistant:

static bool Contains(TBlockType * block, TBlockType * list, TBlockType * tail = nullptr)
    {
        TBlockType * heapBlock = list;
        while (heapBlock != tail)
        {
            if (heapBlock == block)
            {
                return true;
            }
            heapBlock = heapBlock->GetNextBlock();
        }
        return false;
    }